

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderMatrixTests.cpp
# Opt level: O3

Matrix<float,_2,_4> * __thiscall
deqp::gles3::Functional::MatrixCaseUtils::outerProduct<float,4,2>
          (Matrix<float,_2,_4> *__return_storage_ptr__,MatrixCaseUtils *this,Vector<float,_2> *a,
          Vector<float,_4> *b)

{
  Vector<float,_2> *pVVar1;
  float fVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  bool bVar5;
  Matrix<float,_2,_4> *res;
  bool bVar6;
  long lVar7;
  long lVar8;
  float fVar9;
  Matrix<float,_4,_2> retVal;
  
  res = __return_storage_ptr__;
  fVar9 = *(float *)this;
  fVar2 = *(float *)(this + 4);
  retVal.m_data.m_data[0].m_data[1] = fVar9 * a->m_data[1];
  retVal.m_data.m_data[0].m_data[0] = fVar9 * a->m_data[0];
  retVal.m_data.m_data[0].m_data[3] = fVar9 * a[1].m_data[1];
  retVal.m_data.m_data[0].m_data[2] = fVar9 * a[1].m_data[0];
  retVal.m_data.m_data[1].m_data[1] = fVar2 * a->m_data[1];
  retVal.m_data.m_data[1].m_data[0] = fVar2 * a->m_data[0];
  retVal.m_data.m_data[1].m_data[3] = fVar2 * a[1].m_data[1];
  retVal.m_data.m_data[1].m_data[2] = fVar2 * a[1].m_data[0];
  *(undefined8 *)(__return_storage_ptr__->m_data).m_data[2].m_data = 0;
  *(undefined8 *)(__return_storage_ptr__->m_data).m_data[3].m_data = 0;
  *(undefined8 *)(__return_storage_ptr__->m_data).m_data[0].m_data = 0;
  *(undefined8 *)(__return_storage_ptr__->m_data).m_data[1].m_data = 0;
  lVar7 = 0;
  bVar5 = true;
  do {
    bVar6 = bVar5;
    lVar8 = 0;
    do {
      fVar9 = 1.0;
      if (lVar7 != lVar8) {
        fVar9 = 0.0;
      }
      (__return_storage_ptr__->m_data).m_data[lVar8].m_data[lVar7] = fVar9;
      lVar8 = lVar8 + 1;
    } while (lVar8 != 4);
    lVar7 = 1;
    bVar5 = false;
  } while (bVar6);
  lVar7 = 0;
  do {
    uVar3 = *(undefined8 *)(retVal.m_data.m_data[0].m_data + lVar7);
    uVar4 = *(undefined8 *)(retVal.m_data.m_data[1].m_data + lVar7);
    pVVar1 = (__return_storage_ptr__->m_data).m_data + lVar7;
    pVVar1->m_data[0] = (float)uVar3;
    pVVar1->m_data[1] = (float)uVar4;
    pVVar1[1].m_data[0] = (float)((ulong)uVar3 >> 0x20);
    pVVar1[1].m_data[1] = (float)((ulong)uVar4 >> 0x20);
    lVar7 = lVar7 + 2;
  } while (lVar7 != 4);
  return res;
}

Assistant:

tcu::Matrix<T, Cols, Rows> outerProduct (const tcu::Vector<T, Cols>& a, const tcu::Vector<T, Rows>& b)
{
	tcu::Matrix<T, Rows, Cols> retVal;

	for (int r = 0; r < Rows; ++r)
		for (int c = 0; c < Cols; ++c)
			retVal(r,c) = a[c] * b[r];

	return transpose(retVal); // to gl-form (column-major)
}